

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError str2num(long *val,char *str)

{
  long lVar1;
  char *pcVar2;
  int *piVar3;
  long lVar4;
  size_t sVar5;
  long num;
  char *endptr;
  char *str_local;
  long *val_local;
  
  if (str != (char *)0x0) {
    num = 0;
    endptr = str;
    str_local = (char *)val;
    piVar3 = __errno_location();
    *piVar3 = 0;
    lVar4 = strtol(endptr,(char **)&num,10);
    piVar3 = __errno_location();
    pcVar2 = endptr;
    lVar1 = num;
    if (*piVar3 == 0x22) {
      return PARAM_NUMBER_TOO_LARGE;
    }
    if (((char *)num != endptr) && (sVar5 = strlen(endptr), (char *)lVar1 == pcVar2 + sVar5)) {
      *(long *)str_local = lVar4;
      return PARAM_OK;
    }
  }
  return PARAM_BAD_NUMERIC;
}

Assistant:

ParameterError str2num(long *val, const char *str)
{
  if(str) {
    char *endptr = NULL;
    long num;
    errno = 0;
    num = strtol(str, &endptr, 10);
    if(errno == ERANGE)
      return PARAM_NUMBER_TOO_LARGE;
    if((endptr != str) && (endptr == str + strlen(str))) {
      *val = num;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}